

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Terrain.cpp
# Opt level: O1

void mouseScrollCallback(GLFWwindow *window,double xoffset,double yoffset)

{
  ImGuiIO *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  pIVar1 = ImGui::GetIO();
  ImGui_ImplGlfw_ScrollCallback(window,xoffset,yoffset);
  if (pIVar1->WantCaptureMouse == false) {
    fVar3 = (float)yoffset;
    fVar5 = g_camera.axis.m[0].x * fVar3;
    fVar4 = g_camera.axis.m[1].x * fVar3;
    fVar3 = fVar3 * g_camera.axis.m[2].x;
    fVar2 = g_camera.pos.z * g_camera.pos.z +
            g_camera.pos.x * g_camera.pos.x + g_camera.pos.y * g_camera.pos.y;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    g_camera.pos.x = g_camera.pos.x - fVar5 * 0.05 * fVar2;
    g_camera.pos.y = g_camera.pos.y - fVar4 * 0.05 * fVar2;
    g_camera.pos.z = g_camera.pos.z - fVar3 * 0.05 * fVar2;
  }
  return;
}

Assistant:

void mouseScrollCallback(GLFWwindow* window, double xoffset, double yoffset)
{
    ImGuiIO& io = ImGui::GetIO();
    ImGui_ImplGlfw_ScrollCallback(window, xoffset, yoffset);
    if (io.WantCaptureMouse)
        return;

    dja::mat3 axis = dja::transpose(g_camera.axis);
    g_camera.pos -= axis[0] * yoffset * 5e-2 * norm(g_camera.pos);
}